

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O3

int32 count_triphones(char *transfile,dicthashelement_t **dicthash,hashelement_t **tphnhash,
                     phnhashelement_t ***phnhash,int ignore_wpos)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  phnhashelement_t **hashtable;
  lineiter_t *plVar3;
  char *pcVar4;
  void *pvVar5;
  dicthashelement_t *pdVar6;
  size_t sVar7;
  phnhashelement_t *ppVar8;
  hashelement_t *phVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  char *pcVar14;
  undefined8 *puVar15;
  long lVar16;
  bool bVar17;
  char silencephn [4];
  char local_bc [4];
  void *local_b8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  phnhashelement_t **local_a0;
  ulong local_98;
  hashelement_t **local_90;
  uint local_84;
  long local_80;
  lineiter_t *local_78;
  long local_70;
  phnhashelement_t ***local_68;
  char *local_60;
  FILE *local_58;
  dicthashelement_t **local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  builtin_strncpy(local_bc,"SIL",4);
  local_90 = tphnhash;
  local_68 = phnhash;
  __stream = fopen(transfile,"r");
  if (__stream != (FILE *)0x0) {
    local_98 = 0;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x1df,"Out of vocabulary words in transcript will be mapped to SIL!\n");
    hashtable = (phnhashelement_t **)calloc(0x65,0x18);
    plVar3 = lineiter_start_clean((FILE *)__stream);
    local_ac = 0;
    local_a4 = 0;
    local_b0 = 0;
    local_a8 = 0;
    if (plVar3 != (lineiter_t *)0x0) {
      bVar17 = ignore_wpos != 0;
      local_40 = "b";
      if (bVar17) {
        local_40 = "i";
      }
      local_60 = "e";
      if (bVar17) {
        local_60 = "i";
      }
      local_48 = "s";
      if (bVar17) {
        local_48 = "i";
      }
      local_a8 = 0;
      local_b0 = 0;
      local_a4 = 0;
      local_ac = 0;
      local_98 = 0;
      local_a0 = hashtable;
      local_58 = __stream;
      local_50 = dicthash;
      do {
        local_78 = plVar3;
        local_38 = strdup(plVar3->buf);
        pcVar4 = strtok(local_38," \t\n");
        if (pcVar4 != (char *)0x0) {
          lVar10 = 0;
          do {
            pcVar4 = strtok((char *)0x0," \t\n");
            lVar10 = lVar10 + -1;
          } while (pcVar4 != (char *)0x0);
          pvVar5 = __ckd_calloc__(2 - lVar10,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x1f1);
          pcVar4 = strtok(local_78->buf," \t\n");
          pdVar6 = dictlookup(pcVar4,dicthash);
          *(dicthashelement_t **)((long)pvVar5 + 8) = pdVar6;
          local_b8 = pvVar5;
          if (pdVar6 == (dicthashelement_t *)0x0) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                    ,500,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar4);
          }
          pcVar4 = strtok((char *)0x0," \t\n");
          if (pcVar4 != (char *)0x0) {
            puVar15 = (undefined8 *)((long)local_b8 + 0x10);
            do {
              pdVar6 = dictlookup(pcVar4,dicthash);
              *puVar15 = pdVar6;
              if (((pdVar6 == (dicthashelement_t *)0x0) && (*pcVar4 != '(')) &&
                 (sVar7 = strlen(pcVar4), pcVar4[sVar7 - 1] != ')')) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                        ,0x1fb,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar4);
              }
              pcVar4 = strtok((char *)0x0," \t\n");
              puVar15 = puVar15 + 1;
            } while (pcVar4 != (char *)0x0);
          }
          local_98 = (local_98 & 0xffffffff) - lVar10;
          lVar13 = 1;
          lVar10 = 1 - lVar10;
          local_80 = lVar10;
          do {
            lVar1 = *(long *)((long)local_b8 + lVar13 * 8);
            if (lVar1 != 0) {
              lVar16 = (long)*(int *)(lVar1 + 0x10);
              pcVar4 = (char *)**(undefined8 **)(lVar1 + 8);
              ppVar8 = phninstall(pcVar4,hashtable);
              ppVar8->count = ppVar8->count + 1;
              local_70 = lVar16;
              if (lVar16 == 1) {
                if ((*pcVar4 != '+') && (iVar2 = strcmp(pcVar4,"SIL"), iVar2 != 0)) {
                  lVar1 = *(long *)((long)local_b8 + lVar13 * 8 + -8);
                  pcVar12 = local_bc;
                  if ((lVar1 != 0) &&
                     ((pcVar12 = *(char **)(*(long *)(lVar1 + 8) + -8 +
                                           (long)*(int *)(lVar1 + 0x10) * 8), *pcVar12 == '+' ||
                      (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)))) {
                    pcVar12 = local_bc;
                  }
                  lVar1 = *(long *)((long)local_b8 + lVar13 * 8 + 8);
                  pcVar14 = local_bc;
                  if ((lVar1 != 0) &&
                     ((pcVar14 = (char *)**(undefined8 **)(lVar1 + 8), *pcVar14 == '+' ||
                      (iVar2 = strcmp(pcVar14,"SIL"), iVar2 == 0)))) {
                    pcVar14 = local_bc;
                  }
                  phVar9 = lookup(pcVar4,pcVar12,pcVar14,local_48,local_90);
                  phVar9->count = phVar9->count + 1;
                  local_ac = local_ac + 1;
                  hashtable = local_a0;
                }
              }
              else if ((*pcVar4 != '+') && (iVar2 = strcmp(pcVar4,"SIL"), iVar2 != 0)) {
                lVar10 = *(long *)((long)local_b8 + lVar13 * 8 + -8);
                pcVar12 = local_bc;
                if ((lVar10 != 0) &&
                   ((pcVar12 = *(char **)(*(long *)(lVar10 + 8) + -8 +
                                         (long)*(int *)(lVar10 + 0x10) * 8), *pcVar12 == '+' ||
                    (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)))) {
                  pcVar12 = local_bc;
                }
                pcVar14 = *(char **)(*(long *)(*(long *)((long)local_b8 + lVar13 * 8) + 8) + 8);
                if ((*pcVar14 == '+') || (iVar2 = strcmp(pcVar14,"SIL"), iVar2 == 0)) {
                  pcVar14 = local_bc;
                }
                phVar9 = lookup(pcVar4,pcVar12,pcVar14,local_40,local_90);
                phVar9->count = phVar9->count + 1;
                local_84 = (int)local_70 - 1;
                hashtable = local_a0;
                if (2 < (int)local_70) {
                  uVar11 = (ulong)local_84;
                  lVar10 = 0;
                  do {
                    pcVar4 = *(char **)(*(long *)(*(long *)((long)local_b8 + lVar13 * 8) + 8) + 8 +
                                       lVar10 * 8);
                    ppVar8 = phninstall(pcVar4,hashtable);
                    ppVar8->count = ppVar8->count + 1;
                    if ((*pcVar4 != '+') && (iVar2 = strcmp(pcVar4,"SIL"), iVar2 != 0)) {
                      lVar1 = *(long *)(*(long *)((long)local_b8 + lVar13 * 8) + 8);
                      pcVar12 = *(char **)(lVar1 + lVar10 * 8);
                      if ((*pcVar12 == '+') || (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)) {
                        pcVar12 = local_bc;
                      }
                      pcVar14 = *(char **)(lVar1 + 0x10 + lVar10 * 8);
                      if ((*pcVar14 == '+') || (iVar2 = strcmp(pcVar14,"SIL"), iVar2 == 0)) {
                        pcVar14 = local_bc;
                      }
                      phVar9 = lookup(pcVar4,pcVar12,pcVar14,"i",local_90);
                      phVar9->count = phVar9->count + 1;
                      local_a4 = local_a4 + 1;
                      hashtable = local_a0;
                    }
                    lVar10 = lVar10 + 1;
                  } while (uVar11 - 1 != lVar10);
                }
                local_a8 = local_a8 + 1;
                pcVar4 = *(char **)(*(long *)(*(long *)((long)local_b8 + lVar13 * 8) + 8) +
                                   (long)(int)local_84 * 8);
                ppVar8 = phninstall(pcVar4,hashtable);
                ppVar8->count = ppVar8->count + 1;
                lVar10 = local_80;
                if ((*pcVar4 != '+') &&
                   (iVar2 = strcmp(pcVar4,"SIL"), lVar10 = local_80, iVar2 != 0)) {
                  pcVar12 = *(char **)(*(long *)(*(long *)((long)local_b8 + lVar13 * 8) + 8) + -0x10
                                      + local_70 * 8);
                  if ((*pcVar12 == '+') || (iVar2 = strcmp(pcVar12,"SIL"), iVar2 == 0)) {
                    pcVar12 = local_bc;
                  }
                  lVar1 = *(long *)((long)local_b8 + lVar13 * 8 + 8);
                  pcVar14 = local_bc;
                  if ((lVar1 != 0) &&
                     ((pcVar14 = (char *)**(undefined8 **)(lVar1 + 8), *pcVar14 == '+' ||
                      (iVar2 = strcmp(pcVar14,"SIL"), iVar2 == 0)))) {
                    pcVar14 = local_bc;
                  }
                  phVar9 = lookup(pcVar4,pcVar12,pcVar14,local_60,local_90);
                  phVar9->count = phVar9->count + 1;
                  local_b0 = local_b0 + 1;
                  hashtable = local_a0;
                }
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar10 != lVar13);
          free(local_b8);
          dicthash = local_50;
          __stream = local_58;
        }
        free(local_38);
        plVar3 = lineiter_next(local_78);
      } while (plVar3 != (lineiter_t *)0x0);
    }
    fclose(__stream);
    lineiter_free((lineiter_t *)0x0);
    *local_68 = hashtable;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x251,"%d words in transcripts\n",local_98);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x252,"%d single word triphones in transcripts\n",(ulong)local_ac);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x253,"%d word beginning triphones in transcripts\n",(ulong)local_a8);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x254,"%d word internal triphones in transcripts\n",(ulong)local_a4);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x255,"%d word ending triphones in transcripts\n",(ulong)local_b0);
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x1dd,"Unable to open transcript file %s for reading!\n",transfile);
  exit(1);
}

Assistant:

int32  count_triphones (const char *transfile,
			dicthashelement_t **dicthash,
			hashelement_t **tphnhash,
			phnhashelement_t ***phnhash,
			int ignore_wpos)
{
    int32  nbwdtphns, newdtphns, niwdtphns, nswdtphns;
    int32  nwords, lnphns, n_totalwds;
    lineiter_t *line = NULL;
    char *tline;
    char   *word, *basephone, *lctxt, *rctxt; 
    char   silencephn[4];
    const char* wpos;
    int32  i, j;
    dicthashelement_t **wordarr;
    phnhashelement_t **lphnhash, *phnptr;
    hashelement_t *tphnptr;
    FILE   *fp;

    strcpy(silencephn,"SIL");
    if ((fp = fopen(transfile,"r")) == NULL)
	E_FATAL("Unable to open transcript file %s for reading!\n",transfile);

    E_INFO("Out of vocabulary words in transcript will be mapped to SIL!\n");

    lphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));

    n_totalwds = 0;
    nbwdtphns = newdtphns = niwdtphns = nswdtphns = 0;

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

	tline = strdup(line->buf);
        if (strtok(tline," \t\n") == NULL) {
           free(tline);
    	   continue;
        }

        /* Count number of phones in pronunciation */
        for(nwords=1; strtok(NULL," \t\n") != NULL; nwords++);
	n_totalwds += nwords;
	wordarr = (dicthashelement_t **)ckd_calloc(nwords+2,sizeof(dicthashelement_t*));
        word = strtok(line->buf," \t\n"); 
        if ((wordarr[1] = dictlookup(word,dicthash)) == NULL) {
            E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
        }
        for (j=2; (word = strtok(NULL," \t\n")) != NULL; j++) {
            if ((wordarr[j] = dictlookup(word,dicthash)) == NULL) {
                /* If word is surrounded by "()", assume it's the
                 * utterance ID, and don't report it as an OOV */
                if ((word[0] != '(') && (word[strlen(word) - 1] != ')')) {
                    E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
                }
            }
        }       
	for (i=1; i<=nwords; i++){/* Indices account for padded wordarr array */
	    if (wordarr[i] == NULL) continue;

	    lnphns = wordarr[i]->nphns;
	    if (lnphns == 1) {
		wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
		if (wordarr[i-1] != NULL){
		    lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		}
		else lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		nswdtphns++;
	    }
	    else {
		wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
                if (!IS_FILLER(basephone)){
		    if (wordarr[i-1] != NULL){
		        lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		        if (IS_FILLER(lctxt)) lctxt = silencephn;
		    }
		    else lctxt = silencephn;
		    rctxt = wordarr[i]->phones[1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++; 
                    nbwdtphns++;
	        }
		wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
		for (j=1;j<lnphns-1;j++){
		    basephone = wordarr[i]->phones[j];
		    phnptr = phninstall(basephone,lphnhash);
		    phnptr->count++;
		    if (IS_FILLER(basephone)) continue;
		    lctxt = wordarr[i]->phones[j-1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		    rctxt = wordarr[i]->phones[j+1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++;
		    niwdtphns++;
		}

		wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
		basephone = wordarr[i]->phones[lnphns-1];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;

		lctxt = wordarr[i]->phones[lnphns-2];
		if (IS_FILLER(lctxt)) lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		newdtphns++;
	    }
	}
        free(wordarr);
        free(tline);
    }
    fclose(fp);
    lineiter_free(line);

    *phnhash = lphnhash;
    E_INFO("%d words in transcripts\n",n_totalwds);
    E_INFO("%d single word triphones in transcripts\n",nswdtphns);
    E_INFO("%d word beginning triphones in transcripts\n",nbwdtphns);
    E_INFO("%d word internal triphones in transcripts\n",niwdtphns);
    E_INFO("%d word ending triphones in transcripts\n",newdtphns);

    return S3_SUCCESS;
}